

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyAtomicOperations
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  pointer *this_00;
  glUseProgramFunc p_Var1;
  undefined *__s;
  undefined4 sample_00;
  GLint target_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  deUint32 dVar6;
  ostream *poVar7;
  TestError *this_01;
  uchar *ptr;
  uchar *ptr_00;
  char *pcVar8;
  GLchar *pGVar9;
  RenderContext *renderCtx;
  ShaderInfo *pSVar10;
  GLubyte *outDataRegion;
  GLubyte *dataRegion;
  int local_458;
  GLint z;
  GLint y;
  GLint x;
  ShaderProgram program;
  undefined1 local_358 [8];
  ProgramSources sources;
  string local_280 [8];
  string dataType;
  string local_258;
  allocator<char> local_231;
  string local_230;
  undefined1 local_210 [8];
  TokenStrings s;
  undefined1 local_c8 [8];
  string shader;
  GLint sample;
  GLuint verifyTexture;
  GLubyte *out_data;
  GLubyte *exp_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  GLint texSize;
  GLint verifyTarget;
  GLuint GStack_50;
  bool result;
  GLint widthCommitted;
  GLint depth;
  GLint height;
  GLint width;
  int local_34;
  GLuint *pGStack_30;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  UncommittedRegionsAccessTestCase *this_local;
  
  local_34 = level;
  pGStack_30 = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  poVar7 = std::operator<<((ostream *)
                           &(this->super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.field_0x88,
                           "Verify Atomic Operations [level: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_34);
  std::operator<<(poVar7,"] - ");
  if (local_34 <=
      (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1) {
    SparseTextureUtils::getTextureLevelSize
              (texture_local._4_4_,
               &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
                .mState,local_34,&depth,&widthCommitted,(GLint *)&stack0xffffffffffffffb0);
    iVar3 = depth / 2;
    if (((iVar3 == 0) || (widthCommitted == 0)) ||
       ((int)GStack_50 <
        (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        minDepth)) {
      this_local._7_1_ = 1;
    }
    else {
      texSize._3_1_ = 1;
      if (texture_local._4_4_ == 0x9100) {
        vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0xde1;
      }
      else {
        vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0x8c1a;
      }
      iVar4 = depth * widthCommitted * GStack_50;
      this_00 = &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(long)iVar4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data,(long)iVar4);
      ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ptr_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      ::deMemset(ptr,0,(long)iVar4);
      gl4cts::Texture::Generate(_format_local,(GLuint *)(shader.field_2._M_local_buf + 0xc));
      gl4cts::Texture::Bind
                (_format_local,shader.field_2._12_4_,
                 vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      gl4cts::Texture::Storage
                (_format_local,
                 vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1,0x8229,depth,
                 widthCommitted,GStack_50);
      GVar5 = (*_format_local->getError)();
      glu::checkError(GVar5,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0x784);
      for (shader.field_2._8_4_ = 0;
          (int)shader.field_2._8_4_ <
          (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
          mState.samples; shader.field_2._8_4_ = shader.field_2._8_4_ + 1) {
        ::deMemset(ptr_00,0xff,(long)iVar4);
        gl4cts::Texture::Bind
                  (_format_local,shader.field_2._12_4_,
                   vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        gl4cts::Texture::SubImage
                  (_format_local,
                   vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,0,0,0,depth,
                   widthCommitted,GStack_50,0x1903,0x1401,ptr_00);
        GVar5 = (*_format_local->getError)();
        glu::checkError(GVar5,"Texture::SubImage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x78d);
        __s = st2_compute_atomicVerify;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c8,__s,
                   (allocator<char> *)(s.sampleDef.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(s.sampleDef.field_2._M_local_buf + 0xf));
        target_00 = texture_local._4_4_;
        GVar5 = (GLenum)texture_local;
        sample_00 = shader.field_2._8_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"image",&local_231);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"image",
                   (allocator<char> *)(dataType.field_2._M_local_buf + 0xf));
        SparseTexture2CommitmentTestCase::createShaderTokens
                  ((TokenStrings *)local_210,&this->super_SparseTexture2CommitmentTestCase,target_00
                   ,GVar5,sample_00,&local_230,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)(dataType.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator(&local_231);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&s.inputType.field_2 + 8),"ivec4");
        pcVar8 = "uint";
        if (bVar2) {
          pcVar8 = "int";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_280,pcVar8,(allocator<char> *)&sources.field_0xcf);
        std::allocator<char>::~allocator((allocator<char> *)&sources.field_0xcf);
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<OUTPUT_TYPE>",pGVar9,(string *)local_c8);
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<FORMAT>",pGVar9,(string *)local_c8);
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<INPUT_TYPE>",pGVar9,(string *)local_c8);
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<POINT_TYPE>",pGVar9,(string *)local_c8);
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<POINT_DEF>",pGVar9,(string *)local_c8);
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<DATA_TYPE>",pGVar9,(string *)local_c8);
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<SAMPLE_DEF>",pGVar9,(string *)local_c8);
        pGVar9 = (GLchar *)std::__cxx11::string::c_str();
        replaceToken("<RETURN_TYPE>",pGVar9,(string *)local_c8);
        glu::ProgramSources::ProgramSources((ProgramSources *)local_358);
        glu::ComputeSource::ComputeSource
                  ((ComputeSource *)&program.m_program.m_info.linkTimeUs,(string *)local_c8);
        glu::ProgramSources::operator<<
                  ((ProgramSources *)local_358,(ShaderSource *)&program.m_program.m_info.linkTimeUs)
        ;
        glu::ComputeSource::~ComputeSource((ComputeSource *)&program.m_program.m_info.linkTimeUs);
        renderCtx = deqp::Context::getRenderContext
                              ((this->super_SparseTexture2CommitmentTestCase).
                               super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
        glu::ShaderProgram::ShaderProgram((ShaderProgram *)&y,renderCtx,(ProgramSources *)local_358)
        ;
        bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)&y);
        if (bVar2) {
          p_Var1 = _format_local->useProgram;
          dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)&y);
          (*p_Var1)(dVar6);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glUseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7a6);
          (*_format_local->bindImageTexture)(0,shader.field_2._12_4_,0,'\0',0,0x88b9,0x8232);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7ad);
          (*_format_local->bindImageTexture)
                    (1,*pGStack_30,local_34,'\0',0,35000,(GLenum)texture_local);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b4);
          (*_format_local->uniform1i)(1,0);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b6);
          (*_format_local->uniform1i)(2,1);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b8);
          (*_format_local->uniform1i)(3,iVar3);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7ba);
          (*_format_local->dispatchCompute)(depth,widthCommitted,GStack_50);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7bc);
          (*_format_local->memoryBarrier)(0xffffffff);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"glMemoryBarrier",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7be);
          gl4cts::Texture::GetData
                    (_format_local,0,
                     vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x1903,0x1401,ptr_00);
          GVar5 = (*_format_local->getError)();
          glu::checkError(GVar5,"Texture::GetData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7c1);
          for (z = 0; z < depth; z = z + 1) {
            for (local_458 = 0; local_458 < widthCommitted; local_458 = local_458 + 1) {
              for (dataRegion._4_4_ = 0; dataRegion._4_4_ < (int)GStack_50;
                  dataRegion._4_4_ = dataRegion._4_4_ + 1) {
                if (ptr[z + local_458 * depth + dataRegion._4_4_ * depth * widthCommitted] !=
                    ptr_00[z + local_458 * depth + dataRegion._4_4_ * depth * widthCommitted]) {
                  printf("%d:%d ",(ulong)ptr[z + local_458 * depth +
                                             dataRegion._4_4_ * depth * widthCommitted],
                         (ulong)ptr_00[z + local_458 * depth +
                                       dataRegion._4_4_ * depth * widthCommitted]);
                  texSize._3_1_ = 0;
                }
              }
            }
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)
                                   &(this->super_SparseTexture2CommitmentTestCase).
                                    super_SparseTextureCommitmentTestCase.field_0x88,
                                   "Compute shader compilation failed (atomic) for target: ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,texture_local._4_4_);
          poVar7 = std::operator<<(poVar7,", format: ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(GLenum)texture_local);
          poVar7 = std::operator<<(poVar7,", sample: ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,shader.field_2._8_4_);
          poVar7 = std::operator<<(poVar7,", infoLog: ");
          pSVar10 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)&y,SHADERTYPE_COMPUTE,0);
          poVar7 = std::operator<<(poVar7,(string *)&pSVar10->infoLog);
          poVar7 = std::operator<<(poVar7,", shaderSource: ");
          pcVar8 = (char *)std::__cxx11::string::c_str();
          poVar7 = std::operator<<(poVar7,pcVar8);
          std::operator<<(poVar7," - ");
          texSize._3_1_ = 0;
        }
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&y);
        glu::ProgramSources::~ProgramSources((ProgramSources *)local_358);
        std::__cxx11::string::~string(local_280);
        SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings((TokenStrings *)local_210);
        std::__cxx11::string::~string((string *)local_c8);
      }
      gl4cts::Texture::Delete(_format_local,(GLuint *)(shader.field_2._M_local_buf + 0xc));
      this_local._7_1_ = texSize._3_1_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&exp_data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    return (bool)(this_local._7_1_ & 1);
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
             ,0x75e);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyAtomicOperations(const Functions& gl, GLint target, GLint format,
															  GLuint& texture, GLint level)
{
	mLog << "Verify Atomic Operations [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	// Create verifying texture
	GLint verifyTarget;
	if (target == GL_TEXTURE_2D_MULTISAMPLE)
		verifyTarget = GL_TEXTURE_2D;
	else
		verifyTarget = GL_TEXTURE_2D_ARRAY;

	GLint texSize = width * height * depth;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected value in this case is 0 because atomic operations result on uncommitted regions are zeros
	deMemset(exp_data, 0, texSize);

	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	for (GLint sample = 0; sample < mState.samples; ++sample)
	{
		deMemset(out_data, 255, texSize);

		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
						  (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

		std::string shader = st2_compute_atomicVerify;

		// Adjust shader source to texture format
		TokenStrings s		  = createShaderTokens(target, format, sample);
		std::string  dataType = (s.returnType == "ivec4" ? "int" : "uint");

		replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
		replaceToken("<FORMAT>", s.format.c_str(), shader);
		replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
		replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
		replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
		replaceToken("<DATA_TYPE>", dataType.c_str(), shader);
		replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
		replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);

		ProgramSources sources;
		sources << ComputeSource(shader);

		// Build and run shader
		ShaderProgram program(m_context.getRenderContext(), sources);
		if (program.isOk())
		{
			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
			gl.bindImageTexture(0, //unit
								verifyTexture,
								0,		  //level
								GL_FALSE, //layered
								0,		  //layer
								GL_WRITE_ONLY, GL_R8UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.bindImageTexture(1, //unit
								texture,
								level,	//level
								GL_FALSE, //layered
								0,		  //layer
								GL_READ_ONLY, format);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.uniform1i(1, 0 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.uniform1i(2, 1 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.uniform1i(3, widthCommitted /* committed width */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.dispatchCompute(width, height, depth);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
			gl.memoryBarrier(GL_ALL_BARRIER_BITS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

			Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = 0; x < width; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
						GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
						if (dataRegion[0] != outDataRegion[0])
						{
							printf("%d:%d ", dataRegion[0], outDataRegion[0]);
							result = false;
						}
					}
		}
		else
		{
			mLog << "Compute shader compilation failed (atomic) for target: " << target << ", format: " << format
				 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
				 << ", shaderSource: " << shader.c_str() << " - ";

			result = false;
		}
	}

	Texture::Delete(gl, verifyTexture);

	return result;
}